

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPFakeTransmitter::GetLocalHostName
          (RTPFakeTransmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  uint uVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  hostent *phVar4;
  _Node *p_Var5;
  long lVar6;
  size_t sVar7;
  uint8_t *__dest;
  _List_node_base *p_Var8;
  ulong uVar9;
  undefined1 *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__src;
  _Self __tmp;
  _List_node_base *p_Var11;
  uint8_t addr [4];
  string hname;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  allocator<char> local_89;
  ulong *local_88;
  uint local_7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  uint8_t *local_50;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar3 = -0x84;
  if ((this->init == true) && (iVar3 = -0x83, this->created == true)) {
    if (this->localhostname == (uint8_t *)0x0) {
      p_Var11 = (this->localIPs).super__List_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      if (p_Var11 == (_List_node_base *)&this->localIPs) {
        return -0x7f;
      }
      local_48._M_impl._M_node._M_size = 0;
      local_88 = bufferlength;
      local_50 = buffer;
      local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
      local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
      do {
        uVar1 = *(uint *)&p_Var11[1]._M_next;
        local_7c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        phVar4 = gethostbyaddr(&local_7c,4,2);
        if (phVar4 != (hostent *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,phVar4->h_name,&local_89);
          p_Var5 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                   _M_create_node<std::__cxx11::string_const&>
                             ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                              &local_48,&local_78);
          std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
          local_48._M_impl._M_node._M_size = local_48._M_impl._M_node._M_size + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var11 = p_Var11->_M_next;
        p_Var8 = local_48._M_impl._M_node.super__List_node_base._M_next;
      } while (p_Var11 != (_List_node_base *)&this->localIPs);
      for (; p_Var8 != (_List_node_base *)&local_48; p_Var8 = p_Var8->_M_next) {
        lVar6 = std::__cxx11::string::find((char)(p_Var8 + 1),0x2e);
        if (lVar6 != -1) {
          p_Var11 = p_Var8[1]._M_prev;
          this->localhostnamelength = (size_t)p_Var11;
          puVar10 = (undefined1 *)((long)&p_Var11->_M_next + 1);
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            __dest = (uint8_t *)operator_new__((ulong)puVar10);
            this->localhostname = __dest;
          }
          else {
            __dest = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,puVar10,0);
            this->localhostname = __dest;
            if (__dest == (uint8_t *)0x0) goto LAB_00133eba;
          }
          __src = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  p_Var8[1]._M_next;
          sVar7 = this->localhostnamelength;
          goto LAB_00133f02;
        }
      }
      uVar1 = *(uint *)&(this->localIPs).
                        super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        _M_node.super__List_node_base._M_next[1]._M_next;
      snprintf((char *)&local_78,0x10,"%d.%d.%d.%d",(ulong)(uVar1 >> 0x18),
               (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),uVar1 & 0xff);
      sVar7 = strlen((char *)&local_78);
      this->localhostnamelength = (long)(int)sVar7;
      uVar9 = (long)(int)sVar7 + 1;
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        __dest = (uint8_t *)operator_new__(uVar9);
        this->localhostname = __dest;
      }
      else {
        __dest = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,uVar9,0);
        this->localhostname = __dest;
        if (__dest == (uint8_t *)0x0) {
LAB_00133eba:
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&local_48);
          return -1;
        }
      }
      sVar7 = this->localhostnamelength;
      __src = &local_78;
LAB_00133f02:
      bufferlength = local_88;
      memcpy(__dest,__src,sVar7);
      this->localhostname[this->localhostnamelength] = '\0';
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&local_48);
      buffer = local_50;
    }
    uVar9 = this->localhostnamelength;
    if (*bufferlength < uVar9) {
      *bufferlength = uVar9;
      iVar3 = -0x45;
    }
    else {
      memcpy(buffer,this->localhostname,uVar9);
      *bufferlength = this->localhostnamelength;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int RTPFakeTransmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_FAKETRANS_NOLOCALIPS;
		}
		
		std::list<uint32_t>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			struct hostent *he;
			uint8_t addr[4];
			uint32_t ip = (*it);
	
			addr[0] = (uint8_t)((ip>>24)&0xFF);
			addr[1] = (uint8_t)((ip>>16)&0xFF);
			addr[2] = (uint8_t)((ip>>8)&0xFF);
			addr[3] = (uint8_t)(ip&0xFF);
			he = gethostbyaddr((char *)addr,4,AF_INET);
			if (he != 0)
			{
				std::string hname = std::string(he->h_name);
				hostnames.push_back(hname);
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			uint32_t ip;
			int len;
			char str[16];
			
			it = localIPs.begin();
			ip = (*it);
			
			snprintf(str,16,"%d.%d.%d.%d",(int)((ip>>24)&0xFF),(int)((ip>>16)&0xFF),(int)((ip>>8)&0xFF),(int)(ip&0xFF));
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength + 1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}